

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_bar.cpp
# Opt level: O1

int menu_bar_x_offset_proc(Am_Object *self)

{
  uint in_EAX;
  int iVar1;
  Am_Value *pAVar2;
  Am_Widget_Look look;
  undefined8 uStack_18;
  
  uStack_18._0_4_ = in_EAX;
  pAVar2 = Am_Object::Get(self,0x17f,0);
  uStack_18 = (ulong)(uint)uStack_18;
  if ((pAVar2->type != 1) && (pAVar2->type != Am_Widget_Look::Am_Widget_Look_ID)) {
    Am_Widget_Look::TypeError((Am_Widget_Look *)((long)&uStack_18 + 4),pAVar2);
  }
  uStack_18._4_4_ = (pAVar2->value).float_value;
  pAVar2 = Am_Object::Get(self,0x1c8,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  if (uStack_18._4_4_ == (float)Am_MOTIF_LOOK.value) {
    iVar1 = iVar1 + 3;
  }
  return iVar1;
}

Assistant:

Am_Define_Formula(int, menu_bar_x_offset)
{
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);
  int border = self.Get(Am_MENU_BORDER);
  if (look == Am_MOTIF_LOOK)
    return border + 3;
  else
    return border;
}